

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

void next_field_w(wchar_t **wp,wchar_t **start,wchar_t **end,wchar_t *sep)

{
  bool bVar1;
  wchar_t *sep_local;
  wchar_t **end_local;
  wchar_t **start_local;
  wchar_t **wp_local;
  
  while( true ) {
    bVar1 = true;
    if ((**wp != L' ') && (bVar1 = true, **wp != L'\t')) {
      bVar1 = **wp == L'\n';
    }
    if (!bVar1) break;
    *wp = *wp + 1;
  }
  *start = *wp;
  while( true ) {
    bVar1 = false;
    if (((**wp != L'\0') && (bVar1 = false, **wp != L',')) && (bVar1 = false, **wp != L':')) {
      bVar1 = **wp != L'\n';
    }
    if (!bVar1) break;
    *wp = *wp + 1;
  }
  *sep = **wp;
  *end = *wp + -1;
  while( true ) {
    bVar1 = true;
    if ((**end != L' ') && (bVar1 = true, **end != L'\t')) {
      bVar1 = **end == L'\n';
    }
    if (!bVar1) break;
    *end = *end + -1;
  }
  *end = *end + 1;
  if (**wp != L'\0') {
    *wp = *wp + 1;
  }
  return;
}

Assistant:

static void
next_field_w(const wchar_t **wp, const wchar_t **start,
    const wchar_t **end, wchar_t *sep)
{
	/* Skip leading whitespace to find start of field. */
	while (**wp == L' ' || **wp == L'\t' || **wp == L'\n') {
		(*wp)++;
	}
	*start = *wp;

	/* Scan for the separator. */
	while (**wp != L'\0' && **wp != L',' && **wp != L':' &&
	    **wp != L'\n') {
		(*wp)++;
	}
	*sep = **wp;

	/* Trim trailing whitespace to locate end of field. */
	*end = *wp - 1;
	while (**end == L' ' || **end == L'\t' || **end == L'\n') {
		(*end)--;
	}
	(*end)++;

	/* Adjust scanner location. */
	if (**wp != L'\0')
		(*wp)++;
}